

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

NodeAndBucket __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindHelper(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ViewType k,TreeIterator *it)

{
  NodeBase *__n;
  map_index_t b;
  int iVar1;
  NodeBase *pNVar2;
  char *__s2;
  char *pcVar3;
  bool bVar4;
  NodeAndBucket NVar5;
  VariantKey key;
  
  __s2 = k._M_str;
  b = BucketNumber(this,k);
  pNVar2 = (NodeBase *)(this->super_UntypedMapBase).table_[b];
  if (((ulong)pNVar2 & 1) == 0 && pNVar2 != (NodeBase *)0x0) {
    do {
      __n = pNVar2[2].next;
      if (__n == (NodeBase *)k._M_len) {
        if (__n == (NodeBase *)0x0) {
          bVar4 = true;
        }
        else {
          iVar1 = bcmp(pNVar2[1].next,__s2,(size_t)__n);
          bVar4 = iVar1 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4) goto LAB_001bc597;
      pNVar2 = pNVar2->next;
    } while (pNVar2 != (NodeBase *)0x0);
  }
  else if (((ulong)pNVar2 & 1) != 0) {
    pcVar3 = "";
    if (__s2 != (char *)0x0) {
      pcVar3 = __s2;
    }
    key.integral = (uint64_t)k._M_len;
    key.data = pcVar3;
    NVar5 = UntypedMapBase::FindFromTree(&this->super_UntypedMapBase,b,key,it);
    pNVar2 = NVar5.node;
    b = NVar5.bucket;
    goto LAB_001bc597;
  }
  pNVar2 = (NodeBase *)0x0;
LAB_001bc597:
  NVar5.bucket = b;
  NVar5.node = pNVar2;
  NVar5._12_4_ = 0;
  return NVar5;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k,
                           TreeIterator* it = nullptr) const {
    map_index_t b = BucketNumber(k);
    if (TableEntryIsNonEmptyList(b)) {
      auto* node = internal::TableEntryToNode(table_[b]);
      do {
        if (TS::Equals(static_cast<KeyNode*>(node)->key(), k)) {
          return {node, b};
        } else {
          node = node->next;
        }
      } while (node != nullptr);
    } else if (TableEntryIsTree(b)) {
      return FindFromTree(b, internal::RealKeyToVariantKey<Key>{}(k), it);
    }
    return {nullptr, b};
  }